

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O1

void __thiscall Js::ES5Array::MarkVisitKindSpecificPtrs(ES5Array *this,SnapshotExtractor *extractor)

{
  uint uVar1;
  uint uVar2;
  DynamicTypeHandler *pDVar3;
  undefined8 local_40;
  void *descriptorValidationToken;
  IndexPropertyDescriptor *descriptor;
  
  JavascriptArray::MarkVisitKindSpecificPtrs(&this->super_JavascriptArray,extractor);
  uVar1 = (this->super_JavascriptArray).super_ArrayObject.length;
  descriptorValidationToken = (void *)0x0;
  local_40 = 0;
  pDVar3 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  for (uVar2 = (*pDVar3->_vptr_DynamicTypeHandler[0x46])
                         (pDVar3,0xffffffff,&descriptorValidationToken,&local_40); uVar2 < uVar1;
      uVar2 = (*pDVar3->_vptr_DynamicTypeHandler[0x46])
                        (pDVar3,(ulong)uVar2,&descriptorValidationToken,&local_40)) {
    if ((*descriptorValidationToken & 8) == 0) {
      if (*(Var *)((long)descriptorValidationToken + 8) != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar
                  (extractor,*(Var *)((long)descriptorValidationToken + 8));
      }
      if (*(Var *)((long)descriptorValidationToken + 0x10) != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar
                  (extractor,*(Var *)((long)descriptorValidationToken + 0x10));
      }
    }
    pDVar3 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  }
  return;
}

Assistant:

void ES5Array::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        this->JavascriptArray::MarkVisitKindSpecificPtrs(extractor);

        uint32 length = this->GetLength();
        uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
        IndexPropertyDescriptor* descriptor = nullptr;
        void* descriptorValidationToken = nullptr;

        do
        {
            descriptorIndex = this->GetNextDescriptor(descriptorIndex, &descriptor, &descriptorValidationToken);
            if(descriptorIndex == Js::JavascriptArray::InvalidIndex || descriptorIndex >= length)
            {
                break;
            }

            if((descriptor->Attributes & PropertyDeleted) != PropertyDeleted)
            {
                if(descriptor->Getter != nullptr)
                {
                    extractor->MarkVisitVar(descriptor->Getter);
                }

                if(descriptor->Setter != nullptr)
                {
                    extractor->MarkVisitVar(descriptor->Setter);
                }
            }

        } while(true);
    }